

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzerSettings.cpp
# Opt level: O3

void __thiscall
EnrichableI2cAnalyzerSettings::UpdateInterfacesFromSettings(EnrichableI2cAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mSdaChannelInterface)._M_ptr);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mSclChannelInterface)._M_ptr);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mAddressDisplay);
  AnalyzerSettingInterfaceText::SetText((char *)(this->mParserCommandInterface)._M_ptr);
  return;
}

Assistant:

void EnrichableI2cAnalyzerSettings::UpdateInterfacesFromSettings()
{
	mSdaChannelInterface->SetChannel( mSdaChannel );
	mSclChannelInterface->SetChannel( mSclChannel );
	mAddressDisplayInterface->SetNumber( mAddressDisplay );
	mParserCommandInterface->SetText( mParserCommand );
}